

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadixSort.cpp
# Opt level: O3

void srs::radixSort(vector<Graph::Edge,_std::allocator<Graph::Edge>_> *A)

{
  uint64_t *puVar1;
  undefined8 *puVar2;
  value_type *__value;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  Edge *i;
  pointer pEVar6;
  long lVar7;
  pointer pEVar8;
  pointer pEVar9;
  long lVar10;
  pointer pEVar11;
  ulong uVar12;
  long lVar13;
  pointer pEVar14;
  long lVar15;
  array<unsigned_long,_256UL> B;
  vector<Graph::Edge,_std::allocator<Graph::Edge>_> local_848;
  long local_830 [256];
  
  __value = (A->super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>)._M_impl.
            super__Vector_impl_data._M_start;
  std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::vector
            (&local_848,
             (long)(A->super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)__value >> 5,__value,
             (allocator_type *)local_830);
  lVar15 = 0;
  pEVar9 = local_848.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pEVar11 = (A->super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pEVar14 = local_848.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
            super__Vector_impl_data._M_start;
  pEVar6 = (A->super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    pEVar8 = pEVar6;
    memset(local_830,0,0x800);
    if (pEVar11 == pEVar8) {
      lVar7 = 0;
    }
    else {
      pEVar6 = pEVar11;
      do {
        local_830[pEVar6->shift >> ((char)lVar15 * '\b' & 0x3fU) & 0xff] =
             local_830[pEVar6->shift >> ((char)lVar15 * '\b' & 0x3fU) & 0xff] + 1;
        pEVar6 = pEVar6 + 1;
        lVar7 = local_830[0];
      } while (pEVar6 != pEVar8);
    }
    lVar10 = 1;
    do {
      lVar7 = lVar7 + local_830[lVar10];
      local_830[lVar10] = lVar7;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x100);
    local_848.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
    super__Vector_impl_data._M_start = pEVar11;
    if (pEVar11 != pEVar8) {
      lVar7 = (long)pEVar8 - (long)pEVar11 >> 5;
      lVar10 = ((long)pEVar8 - (long)pEVar11) + -8;
      do {
        pEVar11 = (A->super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar12 = *(ulong *)((long)&(pEVar11->super_LightEdge).u + lVar10) >>
                 ((char)lVar15 * '\b' & 0x3fU) & 0xff;
        lVar13 = local_830[uVar12] + -1;
        local_830[uVar12] = lVar13;
        puVar1 = (uint64_t *)((long)pEVar11 + lVar10 + -0x18);
        uVar3 = *puVar1;
        uVar4 = puVar1[1];
        puVar2 = (undefined8 *)((long)pEVar11 + lVar10 + -8);
        uVar5 = puVar2[1];
        lVar10 = lVar10 + -0x20;
        *(undefined8 *)&pEVar14[lVar13].finished = *puVar2;
        *(uint64_t *)(&pEVar14[lVar13].finished + 8) = uVar5;
        pEVar14[lVar13].super_LightEdge.u = uVar3;
        pEVar14[lVar13].super_LightEdge.v = uVar4;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
      pEVar8 = (A->super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      local_848.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
      super__Vector_impl_data._M_start =
           (A->super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>)._M_impl.
           super__Vector_impl_data._M_start;
    }
    local_848.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (A->super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>)._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (A->super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>)._M_impl.
    super__Vector_impl_data._M_start = pEVar14;
    (A->super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>)._M_impl.
    super__Vector_impl_data._M_finish =
         local_848.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (A->super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = pEVar9;
    lVar15 = lVar15 + 1;
    pEVar9 = local_848.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pEVar11 = pEVar14;
    pEVar14 = local_848.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
              super__Vector_impl_data._M_start;
    pEVar6 = local_848.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_848.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
    super__Vector_impl_data._M_finish = pEVar8;
  } while (lVar15 != 8);
  if (local_848.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_848.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_848.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_848.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void srs::radixSort(std::vector<Graph::Edge> &A) {
    std::vector<Graph::Edge> R(A.size(), A[0]);
    for (u64 deg = 0; deg < Digits; ++deg) {
        std::array<u64, Variants> B{};

        for (auto &i : A)
            ++B[ind(i.shift, deg)];

        for (u64 i = 1; i < B.size(); ++i)
            B[i] += B[i - 1];

        for (u64 i = A.size(); i--;)
            R[--B[ind(A[i].shift, deg)]] = A[i];
        std::swap(A, R);
    }
}